

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O2

vec4 ImageCodec::decodeFLOAT_SINTVec<signed_char,3>(ImageCodec *param_1,void *ptr)

{
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 aVar1;
  float *pfVar2;
  int i;
  long lVar3;
  float fVar4;
  float fVar5;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 local_28;
  
  local_28._0_8_ = 0;
  local_28._8_8_ = 0x3f80000000000000;
  for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
    fVar4 = (float)(int)*(char *)((long)ptr + lVar3) / 255.0;
    fVar5 = -1.0;
    if (-1.0 <= fVar4) {
      fVar5 = fVar4;
    }
    pfVar2 = glm::vec<4,_float,_(glm::precision)0>::operator[]
                       ((vec<4,_float,_(glm::precision)0> *)&local_28.field_0,(length_type)lVar3);
    *pfVar2 = fVar5;
  }
  aVar1._8_8_ = local_28._8_8_;
  aVar1._0_8_ = local_28._0_8_;
  return (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)
         (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)aVar1.field_0;
}

Assistant:

static glm::vec4 decodeFLOAT_SINTVec(const ImageCodec*, const void* ptr) {
        static_assert(std::is_signed_v<TYPE>);
        static_assert((COMPONENTS > 0) && (COMPONENTS <= 4));
        auto data = reinterpret_cast<const TYPE*>(ptr);
        const auto upper = static_cast<float>((128u << sizeof(TYPE)) - 1u);
        glm::vec4 result(0.f, 0.f, 0.f, 1.f);
        for (int i = 0; i < COMPONENTS; ++i)
            result[i] = std::max(static_cast<float>(data[i]) / upper, -1.f);
        return result;
    }